

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

int bitset_container_index_equalorlarger(bitset_container_t *container,uint16_t x)

{
  long lVar1;
  uint32_t x32;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar2 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
  uVar3 = (container->words[uVar2] >> ((byte)x & 0x3f)) << ((byte)x & 0x3f);
  if (uVar3 == 0) {
    uVar2 = (ulong)(x >> 6);
    do {
      if (uVar2 == 0x3ff) {
        return -1;
      }
      uVar3 = container->words[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (uVar3 == 0);
  }
  lVar1 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  return (uint)lVar1 | (int)uVar2 << 6;
}

Assistant:

int bitset_container_index_equalorlarger(const bitset_container_t *container, uint16_t x) {
  uint32_t x32 = x;
  uint32_t k = x32 / 64;
  uint64_t word = container->words[k];
  const int diff = x32 - k * 64; // in [0,64)
  word = (word >> diff) << diff; // a mask is faster, but we don't care
  while(word == 0) {
    k++;
    if(k == BITSET_CONTAINER_SIZE_IN_WORDS) return -1;
    word = container->words[k];
  }
  return k * 64 + roaring_trailing_zeroes(word);
}